

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.h
# Opt level: O1

void __thiscall Vector::Normalize(Vector *this)

{
  float fVar1;
  
  if (this->m_length <= 0.0 && this->m_length != 0.0) {
    this->m_length =
         SQRT(this->m_vec[2] * this->m_vec[2] +
              this->m_vec[1] * this->m_vec[1] + this->m_vec[0] * this->m_vec[0]);
  }
  fVar1 = 1.0 / this->m_length;
  this->m_vec[0] = this->m_vec[0] * fVar1;
  this->m_vec[1] = this->m_vec[1] * fVar1;
  this->m_vec[2] = fVar1 * this->m_vec[2];
  this->m_length = 1.0;
  return;
}

Assistant:

void Normalize()
	{
	   float l = 1.f / Length();

	   SetX(X() * l);
	   SetY(Y() * l);
	   SetZ(Z() * l);
	   m_length=1.0f;
	}